

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_st_cond(DisasContext_conflict6 *ctx,int rt,int base,int offset,MemOp_conflict2 tcg_mo,
                _Bool eva)

{
  TCGContext_conflict6 *s;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGv_i64 ret;
  TCGv_i64 pTVar1;
  int local_84;
  TCGLabel *done;
  TCGLabel *l1;
  TCGv_i64 val;
  TCGv_i64 t0;
  TCGv_i64 addr;
  TCGContext_conflict6 *tcg_ctx;
  _Bool eva_local;
  MemOp_conflict2 tcg_mo_local;
  int offset_local;
  int base_local;
  int rt_local;
  DisasContext_conflict6 *ctx_local;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_mips64el(s);
  l_00 = gen_new_label_mips64el(s);
  ret = tcg_temp_new_i64(s);
  pTVar1 = tcg_temp_new_i64(s);
  gen_base_offset_addr(ctx,pTVar1,base,offset);
  tcg_gen_brcond_i64_mips64el(s,TCG_COND_EQ,pTVar1,s->cpu_lladdr,l);
  tcg_temp_free_i64(s,pTVar1);
  tcg_gen_movi_i64_mips64el(s,ret,0);
  gen_store_gpr(s,ret,rt);
  tcg_gen_br(s,l_00);
  gen_set_label(s,l);
  pTVar1 = tcg_temp_new_i64(s);
  gen_load_gpr(s,pTVar1,rt);
  if (eva) {
    local_84 = 2;
  }
  else {
    local_84 = ctx->mem_idx;
  }
  tcg_gen_atomic_cmpxchg_i64_mips64el(s,ret,s->cpu_lladdr,s->cpu_llval,pTVar1,(long)local_84,tcg_mo)
  ;
  tcg_gen_setcond_i64_mips64el(s,TCG_COND_EQ,ret,ret,s->cpu_llval);
  gen_store_gpr(s,ret,rt);
  tcg_temp_free_i64(s,pTVar1);
  gen_set_label(s,l_00);
  tcg_temp_free_i64(s,ret);
  return;
}

Assistant:

static void gen_st_cond(DisasContext *ctx, int rt, int base, int offset,
                        MemOp tcg_mo, bool eva)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv addr, t0, val;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *done = gen_new_label(tcg_ctx);

    t0 = tcg_temp_new(tcg_ctx);
    addr = tcg_temp_new(tcg_ctx);
    /* compare the address against that of the preceeding LL */
    gen_base_offset_addr(ctx, addr, base, offset);
    tcg_gen_brcond_tl(tcg_ctx, TCG_COND_EQ, addr, tcg_ctx->cpu_lladdr, l1);
    tcg_temp_free(tcg_ctx, addr);
    tcg_gen_movi_tl(tcg_ctx, t0, 0);
    gen_store_gpr(tcg_ctx, t0, rt);
    tcg_gen_br(tcg_ctx, done);

    gen_set_label(tcg_ctx, l1);
    /* generate cmpxchg */
    val = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, val, rt);
    tcg_gen_atomic_cmpxchg_tl(tcg_ctx, t0, tcg_ctx->cpu_lladdr, tcg_ctx->cpu_llval, val,
                              eva ? MIPS_HFLAG_UM : ctx->mem_idx, tcg_mo);
    tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, t0, t0, tcg_ctx->cpu_llval);
    gen_store_gpr(tcg_ctx, t0, rt);
    tcg_temp_free(tcg_ctx, val);

    gen_set_label(tcg_ctx, done);
    tcg_temp_free(tcg_ctx, t0);
}